

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O2

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::findAllIntersections
          (Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
           *this,Node *node,
          vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
          *intersections)

{
  undefined8 *puVar1;
  Node *pNVar2;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *in_RCX;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *extraout_RDX;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *extraout_RDX_00;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *extraout_RDX_01;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *extraout_RDX_02;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  Node **value;
  long lVar5;
  Node *node_00;
  bool bVar6;
  pointer local_50;
  pointer ppStack_48;
  Box<float> local_40;
  
  for (uVar3 = 0; uVar3 < (ulong)(*(long *)&this[1].mBox.width - *(long *)&this[1].mBox >> 3);
      uVar3 = uVar3 + 1) {
    lVar5 = 0;
    uVar4 = uVar3;
    while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
      in_RCX = *(vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> **)
                (*(long *)&this[1].mBox + uVar3 * 8);
      local_50 = (in_RCX->
                 super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppStack_48 = (in_RCX->
                   super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
      puVar1 = *(undefined8 **)(*(long *)&this[1].mBox + lVar5);
      local_40._0_8_ = *puVar1;
      local_40._8_8_ = puVar1[1];
      bVar6 = Box<float>::intersects((Box<float> *)&local_50,&local_40);
      intersections = extraout_RDX;
      if (bVar6) {
        std::vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>>::
        emplace_back<Node*&,Node*&>
                  ((vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *)node,
                   (Node **)(*(long *)&this[1].mBox + uVar3 * 8),
                   (Node **)(*(long *)&this[1].mBox + lVar5));
        intersections = extraout_RDX_00;
      }
      lVar5 = lVar5 + 8;
    }
  }
  lVar5._0_4_ = (this->mBox).left;
  lVar5._4_4_ = (this->mBox).top;
  if (lVar5 != 0) {
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 8) {
      pNVar2 = *(Node **)&this[1].mBox.width;
      for (node_00 = *(Node **)&this[1].mBox; node_00 != pNVar2;
          node_00 = (Node *)((node_00->children)._M_elems + 1)) {
        findIntersectionsInDescendants
                  (*(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                     **)((long)&(this->mBox).left + lVar5),node_00,(Node **)node,in_RCX);
        intersections = extraout_RDX_01;
      }
    }
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 8) {
      findAllIntersections
                (*(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                   **)((long)&(this->mBox).left + lVar5),node,intersections);
      intersections = extraout_RDX_02;
    }
  }
  return;
}

Assistant:

void findAllIntersections(Node* node, std::vector<std::pair<T, T>>& intersections) const
    {
        // Find intersections between values stored in this node
        // Make sure to not report the same intersection twice
        for (auto i = std::size_t(0); i < node->values.size(); ++i)
        {
            for (auto j = std::size_t(0); j < i; ++j)
            {
                if (mGetBox(node->values[i]).intersects(mGetBox(node->values[j])))
                    intersections.emplace_back(node->values[i], node->values[j]);
            }
        }
        if (!isLeaf(node))
        {
            // Values in this node can intersect values in descendants
            for (const auto& child : node->children)
            {
                for (const auto& value : node->values)
                    findIntersectionsInDescendants(child.get(), value, intersections);
            }
            // Find intersections in children
            for (const auto& child : node->children)
                findAllIntersections(child.get(), intersections);
        }
    }